

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O2

uchar ** traverse<vector_brodnik<unsigned_char*>,void(*)(unsigned_char**,int,int),unsigned_char>
                   (TrieNode<unsigned_char> *node,uchar **dst,size_t depth,
                   _func_void_uchar_ptr_ptr_int_int *small_sort)

{
  TrieNode<unsigned_char> *node_00;
  size_t sVar1;
  vector_brodnik<unsigned_char_*> *bucket;
  uint i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 != 0x100; uVar2 = uVar2 + 1) {
    node_00 = (TrieNode<unsigned_char> *)(node->buckets)._M_elems[uVar2];
    if (((node->is_trie).super__Base_bitset<4UL>._M_w[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) == 0) {
      if (node_00 != (TrieNode<unsigned_char> *)0x0) {
        sVar1 = vector_brodnik<unsigned_char_*>::size((vector_brodnik<unsigned_char_*> *)node_00);
        copy<unsigned_char*,unsigned_char**>((vector_brodnik<unsigned_char_*> *)node_00,dst);
        if (uVar2 != 0) {
          mkqsort(dst,(int)sVar1,(int)depth);
        }
        dst = dst + sVar1;
        vector_brodnik<unsigned_char_*>::~vector_brodnik((vector_brodnik<unsigned_char_*> *)node_00)
        ;
        operator_delete(node_00);
      }
    }
    else {
      dst = traverse<vector_brodnik<unsigned_char*>,void(*)(unsigned_char**,int,int),unsigned_char>
                      (node_00,dst,depth + 1,small_sort);
    }
  }
  operator_delete(node);
  return dst;
}

Assistant:

static unsigned char**
traverse(TrieNode<CharT>* node,
         unsigned char** dst,
         size_t depth,
         SmallSort small_sort)
{
	for (unsigned i=0; i < max<CharT>::value; ++i) {
		if (node->is_trie[i]) {
			dst = traverse<BucketT>(
				static_cast<TrieNode<CharT>*>(node->buckets[i]),
				dst, depth+sizeof(CharT), small_sort);
		} else {
			BucketT* bucket =
				static_cast<BucketT*>(node->buckets[i]);
			if (not bucket) continue;
			size_t bsize = bucket->size();
			copy(*bucket, dst);
			if (not is_end(i)) small_sort(dst, bsize, depth);
			dst += bsize;
			delete bucket;
		}
	}
	delete node;
	return dst;
}